

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_334836::initiatorFixture::startLoggedOn(initiatorFixture *this)

{
  _func_int **pp_Var1;
  int64_t iVar2;
  undefined4 uVar3;
  Message receivedLogon;
  Message sentLogon;
  int local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  Logon local_170;
  
  FIX::UtcTimeStamp::now();
  *(ulong *)&(this->super_sessionFixture).super_TestCallback.now.super_DateTime.m_date =
       CONCAT44(uStack_2bc,local_2c0);
  (this->super_sessionFixture).super_TestCallback.now.super_DateTime.m_time =
       CONCAT44(uStack_2b4,uStack_2b8);
  uVar3 = *(undefined4 *)
           &(this->super_sessionFixture).super_TestCallback.now.super_DateTime.field_0xc;
  iVar2 = (this->super_sessionFixture).super_TestCallback.now.super_DateTime.m_time;
  (this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.m_date =
       (this->super_sessionFixture).super_TestCallback.now.super_DateTime.m_date;
  *(undefined4 *)
   &(this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.field_0xc = uVar3;
  (this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.m_time = iVar2;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&sentLogon,0x10,0x10,0x10,0xd,5,0x898);
  (this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.m_date = local_2c0;
  *(undefined4 *)
   &(this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.field_0xc =
       uStack_2bc;
  *(undefined4 *)&(this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.m_time
       = uStack_2b8;
  *(undefined4 *)
   ((long)&(this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.m_time + 4) =
       uStack_2b4;
  (this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.m_date = 0;
  pp_Var1 = (this->super_sessionFixture).super_TestCallback.super_Responder._vptr_Responder;
  *(undefined8 *)&(this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.field_0xc
       = *(undefined8 *)
          &(this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_sessionFixture).super_TestCallback.startTimeStamp.super_DateTime.m_time
        + 4);
  (this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.m_date = 0;
  *(undefined8 *)&(this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.field_0xc =
       *(undefined8 *)
        &(this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_sessionFixture).super_TestCallback.endTimeStamp.super_DateTime.m_time +
        4);
  (*pp_Var1[8])(this,1,0,0x1f);
  createLogon((Logon *)&receivedLogon,"TW","ISLD",1);
  FIX::Message::Message(&sentLogon,&receivedLogon);
  FIX::Message::~Message(&receivedLogon);
  FIX::Session::send((Message *)(this->super_sessionFixture).object);
  FIX::Session::next((UtcTimeStamp *)(this->super_sessionFixture).object);
  FIX::Session::logon((this->super_sessionFixture).object);
  createLogon(&local_170,"ISLD","TW",1);
  FIX::Message::Message(&receivedLogon,(Message *)&local_170);
  FIX::Message::~Message((Message *)&local_170);
  FIX::Session::next((Message *)(this->super_sessionFixture).object,(UtcTimeStamp *)&receivedLogon,
                     (bool)((char)this + '\x10'));
  FIX::Message::~Message(&receivedLogon);
  FIX::Message::~Message(&sentLogon);
  return;
}

Assistant:

void startLoggedOn() {
    now = UtcTimeStamp::now();
    startTimeStamp = now;
    endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
    startTime = UtcTimeOnly(startTimeStamp);
    endTime = UtcTimeOnly(endTimeStamp);

    createSession(1, 0, 31);

    FIX::Message sentLogon = createLogon("TW", "ISLD", 1);
    object->send(sentLogon);
    object->next(now);
    object->logon();

    FIX::Message receivedLogon = createLogon("ISLD", "TW", 1);
    object->next(receivedLogon, now);
  }